

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderExecUtil.cpp
# Opt level: O1

string * __thiscall
deqp::gls::ShaderExecUtil::TessEvaluationExecutor::generateTessEvalShader_abi_cxx11_
          (string *__return_storage_ptr__,TessEvaluationExecutor *this,ShaderSpec *shaderSpec)

{
  pointer ppSVar1;
  bool bVar2;
  char *__s;
  size_t sVar3;
  ostream *poVar4;
  ostringstream src;
  undefined1 auStack_198 [8];
  long local_190 [14];
  ios_base local_120 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  __s = glu::getGLSLVersionDeclaration
                  (*(GLSLVersion *)
                    &(this->super_BufferIoExecutor).super_ShaderExecutor._vptr_ShaderExecutor);
  if (__s == (char *)0x0) {
    std::ios::clear((int)auStack_198 + (int)*(undefined8 *)(local_190[0] + -0x18) + 8);
  }
  else {
    sVar3 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,__s,sVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"\n",1);
  bVar2 = glu::glslVersionIsES
                    (*(GLSLVersion *)
                      &(this->super_BufferIoExecutor).super_ShaderExecutor._vptr_ShaderExecutor);
  if (bVar2 && *(int *)&(this->super_BufferIoExecutor).super_ShaderExecutor._vptr_ShaderExecutor < 3
     ) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,"#extension GL_EXT_tessellation_shader : require\n",0x30);
  }
  ppSVar1 = (this->super_BufferIoExecutor).m_program.m_shaders[0].
            super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppSVar1 != (pointer)0x0) {
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_190,
                        (char *)(this->super_BufferIoExecutor).super_ShaderExecutor.m_outputs.
                                super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)ppSVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,"layout(isolines, equal_spacing) in;\n\n",0x25);
  BufferIoExecutor::declareBufferBlocks((ostream *)local_190,(ShaderSpec *)this);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,"void main (void)\n{\n",0x13);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,"\tgl_Position = vec4(gl_TessCoord.x, 0.0, 0.0, 1.0);\n",0x34);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,
             "\thighp uint invocationId = uint(gl_PrimitiveID)*2u + (gl_TessCoord.x > 0.5 ? 1u : 0u);\n"
             ,0x57);
  BufferIoExecutor::generateExecBufferIo((ostream *)local_190,(ShaderSpec *)this,"invocationId");
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"}\n",2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

std::string TessEvaluationExecutor::generateTessEvalShader (const ShaderSpec& shaderSpec)
{
	std::ostringstream src;

	src << glu::getGLSLVersionDeclaration(shaderSpec.version) << "\n";

	if (glu::glslVersionIsES(shaderSpec.version) && shaderSpec.version <= glu::GLSL_VERSION_310_ES)
		src << "#extension GL_EXT_tessellation_shader : require\n";

	if (!shaderSpec.globalDeclarations.empty())
		src << shaderSpec.globalDeclarations << "\n";

	src << "\n";

	src << "layout(isolines, equal_spacing) in;\n\n";

	declareBufferBlocks(src, shaderSpec);

	src << "void main (void)\n{\n"
		<< "\tgl_Position = vec4(gl_TessCoord.x, 0.0, 0.0, 1.0);\n"
		<< "\thighp uint invocationId = uint(gl_PrimitiveID)*2u + (gl_TessCoord.x > 0.5 ? 1u : 0u);\n";

	generateExecBufferIo(src, shaderSpec, "invocationId");

	src	<< "}\n";

	return src.str();
}